

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O3

bool __thiscall Jinx::Impl::Parser::Expect(Parser *this,SymbolType symbol,char *errMsg)

{
  pointer pSVar1;
  bool bVar2;
  char *local_18;
  char *local_10;
  
  if (((this->m_error == false) &&
      (pSVar1 = (this->m_currentSymbol)._M_current,
      pSVar1 != (this->m_symbolList->
                super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>).
                _M_impl.super__Vector_impl_data._M_finish)) && (pSVar1->type == symbol)) {
    this->m_lastLine = pSVar1->lineNumber;
    (this->m_currentSymbol)._M_current = pSVar1 + 1;
    bVar2 = true;
  }
  else {
    local_18 = errMsg;
    if (errMsg == (char *)0x0) {
      local_10 = GetSymbolTypeText(symbol);
      Error<char_const*>(this,"Expected symbol %s",&local_10);
    }
    else {
      Error<char_const*&>(this,"%s",&local_18);
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

inline_t bool Parser::Expect(SymbolType symbol, const char * errMsg)
	{
		if (Accept(symbol))
			return true;
		if (errMsg)
			Error("%s", errMsg);
		else
			Error("Expected symbol %s", GetSymbolTypeText(symbol));
		return false;
	}